

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O1

void split_rects(nhrect *r1,nhrect *r2)

{
  long lVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  nhrect *pnVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  char cVar12;
  char cVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  nhrect *r1_00;
  char cVar17;
  undefined8 local_38;
  
  cVar2 = r1->ly;
  local_38 = (ulong)(byte)r1->hx << 0x30;
  local_38._0_2_ = CONCAT11(r1->hy,r1->lx);
  uVar10 = get_rect_ind(r1);
  if (-1 < (int)uVar10) {
    lVar11 = (long)rect_cnt;
    rect_cnt = rect_cnt + -1;
    rect[uVar10] = *(nhrect *)(&DAT_0035b71c + lVar11 * 4);
  }
  local_38 = CONCAT17(cVar2,(undefined7)local_38);
  lVar11 = (long)rect_cnt;
  if (0 < lVar11) {
    lVar15 = 1;
    pnVar8 = rect + lVar11;
    do {
      uVar9 = local_38;
      r1_00 = pnVar8 + -1;
      cVar3 = r2->lx;
      cVar13 = pnVar8[-1].hx;
      if (cVar3 <= cVar13) {
        cVar4 = r2->ly;
        cVar5 = pnVar8[-1].hy;
        if (cVar4 <= cVar5) {
          cVar6 = r2->hx;
          cVar17 = r1_00->lx;
          if (cVar17 <= cVar6) {
            cVar7 = r2->hy;
            cVar12 = pnVar8[-1].ly;
            if (cVar12 <= cVar7) {
              if (cVar17 < cVar3) {
                cVar17 = cVar3;
              }
              local_38._0_3_ = CONCAT12(cVar17,(ushort)local_38);
              if (cVar12 < cVar4) {
                cVar12 = cVar4;
              }
              local_38._0_4_ = CONCAT13(cVar12,(uint3)local_38);
              if (cVar6 < cVar13) {
                cVar13 = cVar6;
              }
              local_38._0_5_ = CONCAT14(cVar13,(uint)local_38);
              if (cVar7 < cVar5) {
                cVar5 = cVar7;
              }
              local_38._6_2_ = SUB82(uVar9,6);
              local_38._0_6_ = CONCAT15(cVar5,(uint5)local_38);
              if ((cVar17 <= cVar13) && (cVar12 <= cVar5)) {
                split_rects(r1_00,(nhrect *)((long)&local_38 + 2));
              }
            }
          }
        }
      }
      lVar1 = lVar11 + lVar15;
      lVar15 = lVar15 + -1;
      pnVar8 = r1_00;
    } while (1 < lVar1 + -1);
  }
  cVar3 = (char)local_38;
  iVar16 = (int)(char)local_38;
  cVar4 = local_38._7_1_;
  cVar13 = local_38._6_1_;
  if ((int)cVar2 - (int)r2->ly < (int)((uint)('\x13' < local_38._1_1_) * 2 | 0xfffffff5)) {
    local_38._0_3_ = CONCAT12(cVar3,(ushort)local_38);
    local_38._0_4_ = CONCAT13(local_38._7_1_,(uint3)local_38);
    local_38._0_5_ = CONCAT14(local_38._6_1_,(uint)local_38);
    local_38 = (ulong)(uint5)local_38;
    add_rect((nhrect *)((long)&local_38 + 2));
  }
  iVar14 = (int)local_38._1_1_;
  if (iVar16 - r2->lx < (int)((uint)('N' < cVar13) * 3 + -0xd)) {
    local_38._0_3_ = (uint3)(ushort)local_38;
    local_38._0_4_ = CONCAT13(cVar4,(uint3)local_38);
    local_38 = (ulong)(uint)local_38;
    add_rect((nhrect *)((long)&local_38 + 2));
  }
  if (r2->hy - iVar14 < (int)((uint)(cVar4 < '\x01') * 2 | 0xfffffff5)) {
    add_rect((nhrect *)((long)&local_38 + 2));
  }
  if ((int)r2->hx - (int)cVar13 < (int)((uint)((char)local_38 < '\x01') * 3 + -0xd)) {
    add_rect((nhrect *)((long)&local_38 + 2));
  }
  return;
}

Assistant:

void split_rects(struct nhrect *r1, struct nhrect *r2)
{
	struct nhrect r, old_r;
	int i;

	old_r = *r1;
	remove_rect(r1);

	/* Walk down since rect_cnt & rect[] will change... */
	for (i=rect_cnt-1; i>=0; i--)
	    if (intersect(&rect[i], r2, &r))
		split_rects(&rect[i], &r);
	
	if (r2->ly - old_r.ly-1 > (old_r.hy < ROWNO - 1 ? 2*YLIM : YLIM+1)+4) {
		r = old_r;
		r.hy = r2->ly - 2;
		add_rect(&r);
	}
	if (r2->lx - old_r.lx-1 > (old_r.hx < COLNO - 1 ? 2*XLIM : XLIM+1)+4) {
		r = old_r;
		r.hx = r2->lx - 2;
		add_rect(&r);
	}
	if (old_r.hy - r2->hy-1 > (old_r.ly > 0 ? 2*YLIM : YLIM+1)+4) {
		r = old_r;
		r.ly = r2->hy + 2;
		add_rect(&r);
	}
	if (old_r.hx - r2->hx-1 > (old_r.lx > 0 ? 2*XLIM : XLIM+1)+4) {
		r = old_r;
		r.lx = r2->hx + 2;
		add_rect(&r);
	}
}